

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O3

int archive_read_format_ar_cleanup(archive_read *a)

{
  void *__ptr;
  void *__ptr_00;
  
  __ptr = a->format->data;
  __ptr_00 = *(void **)((long)__ptr + 0x20);
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  a->format->data = (void *)0x0;
  return 0;
}

Assistant:

static int
archive_read_format_ar_cleanup(struct archive_read *a)
{
	struct ar *ar;

	ar = (struct ar *)(a->format->data);
	if (ar->strtab)
		free(ar->strtab);
	free(ar);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}